

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O2

int Aig_ManVerifyUsingBdds(Aig_Man_t *pInit,Saig_ParBbr_t *pPars)

{
  Abc_Cex_t *pAVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Aig_Man_t *p;
  Vec_Int_t *p_00;
  int *piVar5;
  Abc_Cex_t *pAVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int i;
  
  iVar8 = 0;
  do {
    iVar10 = pInit->nTruePis;
    if (iVar10 <= iVar8) {
LAB_0064c580:
      if (iVar10 == iVar8) {
        iVar8 = Aig_ManVerifyUsingBdds_int(pInit,pPars);
        return iVar8;
      }
      p = Aig_ManDupTrim(pInit);
      if (pInit->nObjs[2] <= p->nObjs[2]) {
        __assert_fail("Aig_ManCiNum(p) < Aig_ManCiNum(pInit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                      ,0x230,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
      }
      if (p->nRegs != pInit->nRegs) {
        __assert_fail("Aig_ManRegNum(p) == Aig_ManRegNum(pInit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                      ,0x231,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
      }
      iVar8 = Aig_ManVerifyUsingBdds_int(p,pPars);
      if (iVar8 == 0) {
        pAVar1 = p->pSeqModel;
        if (pAVar1 == (Abc_Cex_t *)0x0) {
          __assert_fail("pCexOld != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                        ,0x23a,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
        }
        iVar8 = pInit->nTruePis;
        p_00 = (Vec_Int_t *)malloc(0x10);
        iVar10 = 0x10;
        if (0xe < iVar8 - 1U) {
          iVar10 = iVar8;
        }
        p_00->nSize = 0;
        p_00->nCap = iVar10;
        i = 0;
        if (iVar10 == 0) {
          piVar5 = (int *)0x0;
        }
        else {
          piVar5 = (int *)malloc((long)iVar10 << 2);
        }
        p_00->pArray = piVar5;
        for (; i < iVar8; i = i + 1) {
          pvVar4 = Vec_PtrEntry(pInit->vCis,i);
          piVar5 = *(int **)((long)pvVar4 + 0x28);
          iVar8 = -1;
          if (piVar5 != (int *)0x0) {
            if (0xfffffffd < (piVar5[6] & 7U) - 7) {
              __assert_fail("!Aig_ObjIsNode(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                            ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
            }
            iVar8 = *piVar5;
          }
          Vec_IntPush(p_00,iVar8);
          iVar8 = pInit->nTruePis;
        }
        pAVar6 = Abc_CexAlloc(pInit->nRegs,iVar8,pAVar1->iFrame + 1);
        iVar8 = pAVar1->iFrame;
        pAVar6->iFrame = iVar8;
        pAVar6->iPo = pAVar1->iPo;
        for (uVar3 = 0; (int)uVar3 < pAVar1->nRegs; uVar3 = uVar3 + 1) {
          if (((uint)(&pAVar1[1].iPo)[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
            (&pAVar6[1].iPo)[uVar3 >> 5] = (&pAVar6[1].iPo)[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
          }
        }
        uVar9 = uVar3;
        for (iVar10 = 0; iVar10 <= iVar8; iVar10 = iVar10 + 1) {
          uVar2 = p_00->nSize;
          if (p_00->nSize < 1) {
            uVar2 = 0;
          }
          for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
            if ((p_00->pArray[uVar11] != -1) &&
               (uVar7 = p_00->pArray[uVar11] + uVar3,
               ((uint)(&pAVar1[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0)) {
              iVar8 = uVar9 + (int)uVar11;
              (&pAVar6[1].iPo)[iVar8 >> 5] =
                   (&pAVar6[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
            }
          }
          uVar3 = uVar3 + p->nTruePis;
          uVar9 = uVar9 + pInit->nTruePis;
          iVar8 = pAVar6->iFrame;
        }
        if ((int)uVar9 <= (int)uVar3) {
          __assert_fail("iBitOld < iBitNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                        ,600,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
        }
        if (uVar3 != pAVar1->nBits) {
          __assert_fail("iBitOld == pCexOld->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                        ,0x259,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
        }
        if (uVar9 != pAVar6->nBits) {
          __assert_fail("iBitNew == pCexNew->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                        ,0x25a,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
        }
        free(p_00->pArray);
        free(p_00);
        pInit->pSeqModel = pAVar6;
        Aig_ManStop(p);
        iVar8 = 0;
      }
      else {
        Aig_ManStop(p);
      }
      return iVar8;
    }
    pvVar4 = Vec_PtrEntry(pInit->vCis,iVar8);
    if ((*(uint *)((long)pvVar4 + 0x18) & 0xffffffc0) == 0) {
      iVar10 = pInit->nTruePis;
      goto LAB_0064c580;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Aig_ManVerifyUsingBdds( Aig_Man_t * pInit, Saig_ParBbr_t * pPars )
{
    Abc_Cex_t * pCexOld, * pCexNew;
    Aig_Man_t * p;
    Aig_Obj_t * pObj;
    Vec_Int_t * vInputMap;
    int i, k, Entry, iBitOld, iBitNew, RetValue;
//    pPars->fVerbose = 1;
    // check if there are PIs without fanout
    Saig_ManForEachPi( pInit, pObj, i )
        if ( Aig_ObjRefs(pObj) == 0 )
            break;
    if ( i == Saig_ManPiNum(pInit) )
        return Aig_ManVerifyUsingBdds_int( pInit, pPars );
    // create new AIG
    p = Aig_ManDupTrim( pInit );
    assert( Aig_ManCiNum(p) < Aig_ManCiNum(pInit) );
    assert( Aig_ManRegNum(p) == Aig_ManRegNum(pInit) );
    RetValue = Aig_ManVerifyUsingBdds_int( p, pPars );
    if ( RetValue != 0 )
    {
        Aig_ManStop( p );
        return RetValue;
    }
    // the problem is satisfiable - remap the pattern
    pCexOld = p->pSeqModel;
    assert( pCexOld != NULL );
    // create input map
    vInputMap = Vec_IntAlloc( Saig_ManPiNum(pInit) );
    Saig_ManForEachPi( pInit, pObj, i )
        if ( pObj->pData != NULL )
            Vec_IntPush( vInputMap, Aig_ObjCioId((Aig_Obj_t *)pObj->pData) );
        else
            Vec_IntPush( vInputMap, -1 );
    // create new pattern
    pCexNew = Abc_CexAlloc( Saig_ManRegNum(pInit), Saig_ManPiNum(pInit), pCexOld->iFrame+1 );
    pCexNew->iFrame = pCexOld->iFrame;
    pCexNew->iPo    = pCexOld->iPo;
    // copy the bit-data
    for ( iBitOld = 0; iBitOld < pCexOld->nRegs; iBitOld++ )
        if ( Abc_InfoHasBit( pCexOld->pData, iBitOld ) )
            Abc_InfoSetBit( pCexNew->pData, iBitOld );
    // copy the primary input data
    iBitNew = iBitOld;
    for ( i = 0; i <= pCexNew->iFrame; i++ )
    {
        Vec_IntForEachEntry( vInputMap, Entry, k )
        {
            if ( Entry == -1 )
                continue;
            if ( Abc_InfoHasBit( pCexOld->pData, iBitOld + Entry ) )
                Abc_InfoSetBit( pCexNew->pData, iBitNew + k );
        }
        iBitOld += Saig_ManPiNum(p);
        iBitNew += Saig_ManPiNum(pInit);
    }
    assert( iBitOld < iBitNew );
    assert( iBitOld == pCexOld->nBits );
    assert( iBitNew == pCexNew->nBits );
    Vec_IntFree( vInputMap );
    pInit->pSeqModel = pCexNew;
    Aig_ManStop( p );
    return 0;
}